

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  BPMNode **ppBVar1;
  BPMNode **ppBVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  BPMNode *pBVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  ulong uVar10;
  
  uVar8 = lists->nextfree;
  if (lists->numfree <= uVar8) {
    uVar5 = (ulong)lists->memsize;
    if (uVar5 != 0) {
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar13 = vpbroadcastq_avx512f(ZEXT816(0x18));
      auVar14 = vpbroadcastq_avx512f(ZEXT816(0x10));
      uVar9 = uVar5 + 0xf & 0xfffffffffffffff0;
      auVar15 = vpbroadcastq_avx512f();
      do {
        auVar16 = vpmullq_avx512dq(auVar11,auVar13);
        auVar17 = vpmullq_avx512dq(auVar12,auVar13);
        uVar3 = vpcmpuq_avx512f(auVar12,auVar15,2);
        uVar4 = vpcmpuq_avx512f(auVar11,auVar15,2);
        auVar12 = vpaddq_avx512f(auVar12,auVar14);
        auVar11 = vpaddq_avx512f(auVar11,auVar14);
        uVar9 = uVar9 - 0x10;
        vpscatterqd_avx512f(ZEXT832(lists->memory) + ZEXT832(0x10) + auVar17._0_32_,uVar3,
                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        vpscatterqd_avx512f(ZEXT832(lists->memory) + ZEXT832(0x10) + auVar16._0_32_,uVar4,
                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      } while (uVar9 != 0);
    }
    uVar8 = lists->listsize;
    if ((ulong)uVar8 != 0) {
      ppBVar1 = lists->chains0;
      ppBVar2 = lists->chains1;
      uVar9 = 0;
      do {
        for (pBVar6 = ppBVar1[uVar9]; pBVar6 != (BPMNode *)0x0; pBVar6 = pBVar6->tail) {
          pBVar6->in_use = 1;
        }
        for (pBVar6 = ppBVar2[uVar9]; pBVar6 != (BPMNode *)0x0; pBVar6 = pBVar6->tail) {
          pBVar6->in_use = 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar8);
    }
    lists->numfree = 0;
    if (uVar5 != 0) {
      lVar7 = 0;
      uVar9 = 0;
      do {
        uVar10 = uVar9;
        if (*(int *)((long)&lists->memory->in_use + lVar7) == 0) {
          uVar8 = (int)uVar9 + 1;
          uVar10 = (ulong)uVar8;
          lists->numfree = uVar8;
          lists->freelist[uVar9] = (BPMNode *)((long)&lists->memory->weight + lVar7);
        }
        lVar7 = lVar7 + 0x18;
        uVar9 = uVar10;
      } while (uVar5 * 0x18 != lVar7);
    }
    uVar8 = 0;
  }
  lists->nextfree = uVar8 + 1;
  pBVar6 = lists->freelist[uVar8];
  pBVar6->weight = weight;
  pBVar6->index = index;
  pBVar6->tail = tail;
  return pBVar6;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}